

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O0

void ogt_mesh_remove_duplicate_vertices(ogt_voxel_meshify_context *ctx,ogt_mesh *mesh)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t *puVar4;
  ogt_mesh_vertex *vertex_data;
  bool bVar5;
  uint32_t *table;
  void *__s;
  uint32_t *puVar6;
  uint local_70;
  uint32_t i_1;
  uint32_t src_index;
  uint32_t dst_index;
  uint32_t i;
  uint32_t *hash_table_entry;
  uint32_t vertex_index;
  uint32_t num_unique_vertices;
  uint32_t *remap_indices;
  uint32_t *hash_table;
  uint32_t hash_table_mask;
  uint32_t hash_table_size;
  uint32_t vertex_size;
  uint32_t vertex_count;
  uint8_t *vertices;
  uint32_t index_count;
  uint32_t *indices;
  ogt_mesh *mesh_local;
  ogt_voxel_meshify_context *ctx_local;
  
  puVar4 = mesh->indices;
  uVar1 = mesh->index_count;
  vertex_data = mesh->vertices;
  uVar2 = mesh->vertex_count;
  bVar5 = false;
  if ((((puVar4 != (uint32_t *)0x0) && (bVar5 = false, uVar1 != 0)) &&
      (bVar5 = false, vertex_data != (ogt_mesh_vertex *)0x0)) && (bVar5 = false, uVar2 != 0)) {
    bVar5 = true;
  }
  if (!bVar5) {
    __assert_fail("indices && index_count && vertices && vertex_count && vertex_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                  ,0x1ab,
                  "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
                 );
  }
  for (hash_table._4_4_ = 1; hash_table._4_4_ < uVar2; hash_table._4_4_ = hash_table._4_4_ << 1) {
  }
  table = (uint32_t *)_voxel_meshify_malloc(ctx,(ulong)hash_table._4_4_ << 2);
  memset(table,0xff,(ulong)hash_table._4_4_ << 2);
  __s = _voxel_meshify_malloc(ctx,(ulong)uVar2 << 2);
  memset(__s,0xff,(ulong)uVar2 << 2);
  hash_table_entry._4_4_ = 0;
  for (hash_table_entry._0_4_ = 0; (uint)hash_table_entry < uVar2;
      hash_table_entry._0_4_ = (uint)hash_table_entry + 1) {
    puVar6 = hash_table_find_vertex
                       (table,hash_table._4_4_ - 1,(uint8_t *)vertex_data,0x20,
                        (uint)hash_table_entry);
    if (*puVar6 == 0xffffffff) {
      *puVar6 = (uint)hash_table_entry;
      *(uint *)((long)__s + (ulong)(uint)hash_table_entry * 4) = hash_table_entry._4_4_;
      hash_table_entry._4_4_ = hash_table_entry._4_4_ + 1;
    }
    else {
      if (*(int *)((long)__s + (ulong)*puVar6 * 4) == -1) {
        __assert_fail("remap_indices[*hash_table_entry] != UINT32_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                      ,0x1c2,
                      "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
                     );
      }
      *(undefined4 *)((long)__s + (ulong)(uint)hash_table_entry * 4) =
           *(undefined4 *)((long)__s + (ulong)*puVar6 * 4);
    }
  }
  for (src_index = 0; src_index < uVar2; src_index = src_index + 1) {
    uVar3 = *(uint *)((long)__s + (ulong)src_index * 4);
    if (src_index < uVar3) {
      __assert_fail("dst_index <= src_index",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                    ,0x1cb,
                    "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
                   );
    }
    memcpy((uint8_t *)((long)&(vertex_data->pos).x + (ulong)(uVar3 * 0x20)),
           (uint8_t *)((long)&(vertex_data->pos).x + (ulong)(src_index * 0x20)),0x20);
  }
  for (local_70 = 0; local_70 < uVar1; local_70 = local_70 + 1) {
    puVar4[local_70] = *(uint32_t *)((long)__s + (ulong)puVar4[local_70] * 4);
  }
  _voxel_meshify_free(ctx,table);
  _voxel_meshify_free(ctx,__s);
  if (hash_table_entry._4_4_ <= mesh->vertex_count) {
    mesh->vertex_count = hash_table_entry._4_4_;
    return;
  }
  __assert_fail("num_unique_vertices <= mesh->vertex_count",
                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                ,0x1d6,
                "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
               );
}

Assistant:

void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context* ctx, ogt_mesh* mesh) {
    
    uint32_t* indices      = mesh->indices;
    uint32_t  index_count  = mesh->index_count;
    uint8_t*  vertices     = (uint8_t*)mesh->vertices;
    uint32_t  vertex_count = mesh->vertex_count;
    uint32_t  vertex_size  = sizeof(ogt_mesh_vertex);
    assert(indices && index_count && vertices && vertex_count && vertex_size);
    
    // allocate a hash table that is sized at the next power of 2 above the vertex count
    uint32_t hash_table_size = 1;
    while (hash_table_size < vertex_count)
        hash_table_size *= 2;
    uint32_t hash_table_mask = hash_table_size - 1;
    uint32_t* hash_table = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * hash_table_size);
    memset(hash_table, -1, hash_table_size * sizeof(uint32_t));

    // generate an remap table for vertex indices
    uint32_t* remap_indices = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * vertex_count);
    memset(remap_indices, -1, vertex_count * sizeof(uint32_t));
    uint32_t num_unique_vertices = 0;
    for (uint32_t vertex_index = 0; vertex_index < vertex_count; vertex_index++) {
        uint32_t* hash_table_entry = hash_table_find_vertex(hash_table, hash_table_mask, vertices, vertex_size, vertex_index);
        if (*hash_table_entry == UINT32_MAX) {
            // vertex is not already in the hash table. allocate a unique index for it.
            *hash_table_entry = vertex_index;;
            remap_indices[vertex_index] = num_unique_vertices++;
        }
        else {
            // vertex is already in the hash table. Point this to the index that is already existing!
            assert(remap_indices[*hash_table_entry] != UINT32_MAX);
            remap_indices[vertex_index] = remap_indices[*hash_table_entry];
        }
    }

    // compact all vertices using the remap_indices map.
    for (uint32_t i = 0; i < vertex_count; i++) {
        uint32_t dst_index = remap_indices[i];
        uint32_t src_index = i;
        assert(dst_index <= src_index);
        memcpy(&vertices[dst_index*vertex_size], &vertices[src_index*vertex_size], vertex_size);
    }
    // remap all indices now
    for (uint32_t i = 0; i < index_count; i++) {
        indices[i] = remap_indices[indices[i]];
    }

    _voxel_meshify_free(ctx, hash_table);
    _voxel_meshify_free(ctx, remap_indices);

    assert(num_unique_vertices <= mesh->vertex_count);
    mesh->vertex_count = num_unique_vertices;
}